

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::loadMatrixVecs(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this)

{
  long lVar1;
  SPxOut *pSVar2;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  ulong uVar4;
  long lVar5;
  Verbosity old_verbosity;
  Verbosity local_1c;
  
  pSVar2 = this->spxout;
  if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
    local_1c = pSVar2->m_verbosity;
    (*pSVar2->_vptr_SPxOut[2])();
    pSVar2 = soplex::operator<<(this->spxout,"IBASIS01 loadMatrixVecs() invalidates factorization");
    std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_1c);
  }
  this->nzCount = 0;
  uVar4 = (ulong)(uint)(this->theLP->thecovectors->set).thenum;
  lVar1 = uVar4 * 8;
  while( true ) {
    lVar5 = lVar1 + -8;
    if ((int)uVar4 < 1) break;
    pSVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::vector(this->theLP,
                      (SPxId *)((long)&(this->theBaseId).data[-1].super_DataKey.info + lVar1));
    *(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      **)((long)(this->matrix).data + lVar5) = pSVar3;
    this->nzCount = this->nzCount + *(int *)(*(long *)((long)(this->matrix).data + lVar5) + 0xc);
    uVar4 = (ulong)((int)uVar4 - 1);
    lVar1 = lVar5;
  }
  this->matrixIsSetup = true;
  this->factorized = false;
  if (this->factor !=
      (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    (*this->factor->_vptr_SLinSolver[2])();
  }
  return;
}

Assistant:

void SPxBasisBase<R>::loadMatrixVecs()
{
   assert(theLP != nullptr);
   assert(theLP->dim() == matrix.size());

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS01 loadMatrixVecs() invalidates factorization"
                 << std::endl;)

   int i;
   nzCount = 0;

   for(i = theLP->dim() - 1; i >= 0; --i)
   {
      matrix[i] = &theLP->vector(baseId(i));
      nzCount += matrix[i]->size();
   }

   matrixIsSetup = true;
   factorized = false;

   if(factor != nullptr)
      factor->clear();
}